

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

void __thiscall FString::Insert(FString *this,size_t index,char *instr,size_t instrlen)

{
  char *pcVar1;
  FStringData *pFVar2;
  ulong uVar3;
  size_t strlen;
  void *__dest;
  size_t __n;
  FStringData *old;
  
  if (instrlen != 0) {
    pcVar1 = this->Chars;
    uVar3 = (ulong)*(uint *)(pcVar1 + -0xc);
    __n = uVar3 - index;
    if (index <= uVar3 && __n != 0) {
      strlen = uVar3 + instrlen;
      if (*(int *)(pcVar1 + -4) < 2) {
        ReallocBuffer(this,strlen);
        memmove(this->Chars + index + instrlen,this->Chars + index,__n + 1);
        memcpy(this->Chars + index,instr,instrlen);
        return;
      }
      pFVar2 = FStringData::Alloc(strlen);
      this->Chars = (char *)(pFVar2 + 1);
      pFVar2->Len = (uint)strlen;
      memcpy(pFVar2 + 1,pcVar1,index);
      __dest = (void *)((long)&pFVar2[1].Len + index);
      *(undefined1 *)((long)&pFVar2[1].Len + index) = 0;
      memcpy(__dest,instr,instrlen);
      *(undefined1 *)(instrlen + (long)__dest) = 0;
      memcpy((void *)((long)__dest + instrlen),pcVar1 + index,__n);
      *(undefined1 *)(__n + (long)((long)__dest + instrlen)) = 0;
      FStringData::Release((FStringData *)(pcVar1 + -0xc));
      return;
    }
    ReallocBuffer(this,uVar3 + instrlen);
    pcVar1 = this->Chars;
    memcpy(pcVar1 + uVar3,instr,instrlen);
    (pcVar1 + uVar3)[instrlen] = '\0';
  }
  return;
}

Assistant:

void FString::Insert (size_t index, const char *instr, size_t instrlen)
{
	if (instrlen > 0)
	{
		size_t mylen = Len();
		if (index >= mylen)
		{
			AppendCStrPart(instr, instrlen);
		}
		else if (Data()->RefCount <= 1)
		{
			ReallocBuffer(mylen + instrlen);
			memmove(Chars + index + instrlen, Chars + index, (mylen - index + 1) * sizeof(char));
			memcpy(Chars + index, instr, instrlen * sizeof(char));
		}
		else
		{
			FStringData *old = Data();
			AllocBuffer(mylen + instrlen);
			StrCopy(Chars, old->Chars(), index);
			StrCopy(Chars + index, instr, instrlen);
			StrCopy(Chars + index + instrlen, old->Chars() + index, mylen - index);
			old->Release();
		}
	}
}